

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

char * get_line(void)

{
  char *pcVar1;
  char cVar2;
  ifdef_state *piVar3;
  file_info *pfVar4;
  int iVar5;
  ulong uVar6;
  ifdef_state *piVar7;
  size_t sVar8;
  char *pcVar9;
  ushort **ppuVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char **ppcVar14;
  void *t1;
  char var_name [80];
  char local_88 [88];
  
  do {
    do {
      while( true ) {
        while( true ) {
          while ((saw_eof != '\0' || (iVar5 = getc((FILE *)input_file->file), iVar5 == -1))) {
            pfVar4 = input_file;
            piVar7 = ifdef;
            if (input_file->next == (file_info *)0x0) {
              if (line != (char *)0x0) {
                free(line);
              }
              saw_eof = '\x01';
              line = (char *)0x0;
              cptr = line;
              return line;
            }
            while ((piVar7 != (ifdef_state *)0x0 && (piVar7->file == input_file))) {
              error(piVar7->lineno,(char *)0x0,(char *)0x0,"No %%endif for %%if");
              piVar3 = ifdef->next;
              ifdef = piVar3;
              free(piVar7);
              piVar7 = piVar3;
            }
            fclose((FILE *)input_file->file);
            free(input_file->name);
            input_file = input_file->next;
            free(pfVar4);
          }
          if ((line == (char *)0x0) || (linesize != 0x65)) {
            if (line != (char *)0x0) {
              free(line);
            }
            linesize = 0x65;
            line = (char *)malloc(0x65);
            if (line == (char *)0x0) {
              no_space();
            }
          }
          input_file->lineno = input_file->lineno + 1;
          *line = (char)iVar5;
          if ((char)iVar5 == '\n') {
            lVar13 = 0;
          }
          else {
            lVar13 = 0;
            do {
              if ((long)linesize <= lVar13 + 2) {
                linesize = linesize + 100;
                line = (char *)realloc(line,(ulong)(uint)linesize);
                if (line == (char *)0x0) {
                  no_space();
                }
              }
              iVar5 = getc((FILE *)input_file->file);
              if (iVar5 == -1) {
                saw_eof = '\x01';
                iVar5 = 10;
              }
              line[lVar13 + 1] = (char)iVar5;
              lVar13 = lVar13 + 1;
            } while ((char)iVar5 != '\n');
          }
          line[lVar13 + 1] = '\0';
          pcVar9 = line;
          iVar5 = strncmp(line,"%ifdef ",7);
          if ((iVar5 == 0) || (iVar5 = strncmp(pcVar9,"%ifndef ",8), iVar5 == 0)) break;
          iVar5 = strncmp(pcVar9,"%endif",6);
          piVar7 = ifdef;
          if (iVar5 == 0) {
            if ((ifdef == (ifdef_state *)0x0) || (ifdef->file != input_file)) {
              error(input_file->lineno,(char *)0x0,(char *)0x0,
                    "There is no corresponding %%ifdef for %%endif");
            }
            else if (ifdef->nested == 0) {
              ifdef = ifdef->next;
              free(piVar7);
            }
            else {
              ifdef->nested = ifdef->nested + -1;
            }
          }
          else if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) {
            iVar5 = strncmp(pcVar9,"%include ",9);
            if (iVar5 == 0) {
              ppuVar10 = __ctype_b_loc();
              pcVar12 = pcVar9 + 8;
              pcVar9 = pcVar9 + 9;
              do {
                pcVar11 = pcVar9;
                pcVar1 = pcVar12 + 1;
                pcVar12 = pcVar12 + 1;
                pcVar9 = pcVar11 + 1;
              } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
              for (; (*pcVar11 != '\n' && (*pcVar11 != ' ')); pcVar11 = pcVar11 + 1) {
              }
              *pcVar11 = '\0';
              read_from_file(pcVar12);
            }
            else {
              iVar5 = strncmp(pcVar9,"%define ",8);
              if (iVar5 != 0) {
                if (Eflag == 0) {
                  cptr = line;
                  return line;
                }
                printf("YPP: %s",pcVar9);
                cptr = line;
                return line;
              }
              for (uVar6 = 0; (cVar2 = pcVar9[uVar6 + 8], cVar2 != '\n' && (cVar2 != ' '));
                  uVar6 = uVar6 + 1) {
                local_88[uVar6] = cVar2;
              }
              local_88[uVar6 & 0xffffffff] = '\0';
              ppcVar14 = defd_vars;
              if (defd_vars[0] != (char *)0x0) {
                ppcVar14 = defd_vars;
                pcVar9 = defd_vars[0];
                do {
                  iVar5 = strcmp(pcVar9,local_88);
                  if (iVar5 == 0) {
                    error(input_file->lineno,(char *)0x0,(char *)0x0,
                          "Preprocessor variable %s already defined",local_88);
                  }
                  pcVar9 = ppcVar14[1];
                  ppcVar14 = ppcVar14 + 1;
                } while (pcVar9 != (char *)0x0);
              }
              sVar8 = strlen(local_88);
              pcVar9 = (char *)malloc((ulong)((int)sVar8 + 1));
              *ppcVar14 = pcVar9;
              strcpy(pcVar9,local_88);
              ppcVar14[1] = (char *)0x0;
            }
          }
        }
        ppuVar10 = __ctype_b_loc();
        pcVar12 = pcVar9 + 6;
        pcVar9 = pcVar9 + 7;
        do {
          pcVar11 = pcVar9;
          pcVar1 = pcVar12 + 1;
          pcVar12 = pcVar12 + 1;
          pcVar9 = pcVar11 + 1;
        } while ((*(byte *)((long)*ppuVar10 + (long)*pcVar1 * 2 + 1) & 0x20) != 0);
        for (; (*pcVar11 != '\n' && (*pcVar11 != ' ')); pcVar11 = pcVar11 + 1) {
        }
        *pcVar11 = '\0';
        if ((ifdef == (ifdef_state *)0x0) || (ifdef->state == 0)) break;
        ifdef->nested = ifdef->nested + 1;
      }
      piVar7 = (ifdef_state *)allocate(0x20);
      piVar7->next = ifdef;
      pfVar4 = input_file;
      piVar7->file = input_file;
      piVar7->lineno = pfVar4->lineno;
      cVar2 = line[3];
      piVar7->state = (uint)(cVar2 != 'n');
      piVar7->nested = 0;
      ifdef = piVar7;
    } while (defd_vars[0] == (char *)0x0);
    ppcVar14 = defd_vars;
    pcVar9 = defd_vars[0];
    do {
      ppcVar14 = ppcVar14 + 1;
      iVar5 = strcmp(pcVar9,pcVar12);
      if (iVar5 == 0) {
        piVar7->state = cVar2 != 'n' ^ 1;
        break;
      }
      pcVar9 = *ppcVar14;
    } while (pcVar9 != (char *)0x0);
  } while( true );
}

Assistant:

char *get_line() {
  extern int Eflag;
  int c;
  int i;

 NextLine:;
  i = 0;

  if (saw_eof || (c = getc(input_file->file)) == EOF) {

    /* end of current file */
    if (input_file->next) {
      void *t = input_file;
      while (ifdef && ifdef->file == input_file) {
	void *t1 = ifdef;
	error(ifdef->lineno, 0, 0, "No %%endif for %%if");
	ifdef = ifdef->next;
	FREE(t1); }
      fclose(input_file->file);
      FREE(input_file->name);
      input_file = input_file->next;
      FREE(t);
      goto NextLine;
    }

    if (line) FREE(line);
    saw_eof = 1;
    return line = cptr = 0;
  }
  if (line == 0 || linesize != (LINESIZE + 1)) {
    if (line) FREE(line);
    linesize = LINESIZE + 1;
    if (!(line = MALLOC(linesize))) no_space();
  }
  ++input_file->lineno;
  while ((line[i] = c) != '\n') {
    if (++i + 1 >= linesize)
      if (!(line = REALLOC(line, linesize += LINESIZE)))
	no_space();
    if ((c = getc(input_file->file)) == EOF) {
      c = '\n';
      saw_eof = 1;
    }
  }
  line[i+1] = 0;

  /* VM: process %ifdef/%ifndef line */
  if (!strncmp(&line[0], "%ifdef ", 7) || !strncmp(&line[0], "%ifndef ", 8)) {
    char *var_name = line + 7;
    char **ps;
    while (isspace(*var_name)) var_name++;
    for(i=0; var_name[i]!='\n' && var_name[i]!=' '; i++);
    var_name[i] = 0;
    if (ifdef && ifdef->state) {
      ifdef->nested++;
    } else {
      struct ifdef_state *n = NEW(struct ifdef_state);
      n->next = ifdef;
      n->file = input_file;
      n->lineno = input_file->lineno;
      n->state = line[3] != 'n';
      n->nested = 0;
      ifdef = n;
      /* Find the preprocessor variable */
      for(ps=&defd_vars[0]; *ps; ps++) {
	if(strcmp(*ps,var_name)==0) {
	  n->state ^= 1;
	  break;
	}
      }
    }
    goto NextLine;
  }

  /* VM: process %endif line */
  if(strncmp(&line[0], "%endif", 6)==0) {
    if(!ifdef || ifdef->file != input_file) {
      error(input_file->lineno, 0, 0, "There is no corresponding %%ifdef for %%endif");
    } else {
      if (ifdef->nested)
	ifdef->nested--;
      else {
	void *t = ifdef;
	ifdef = ifdef->next;
	FREE(t);
      }
    }
    goto NextLine;
  }

  /* VM: skip ordinary lines if ordered by %endif */
  if (ifdef && ifdef->state) {
    goto NextLine;
  }

  /* VM: Process %include line */
  if(strncmp(&line[0], "%include ", 9)==0) {
    char *name = line+9;
    while (isspace(*name)) name++;
    for(i=0; name[i]!='\n' && name[i]!=' '; i++);
    name[i] = 0;
    read_from_file(name);
    goto NextLine;
  }

  /* VM: process %define line */
  if(strncmp(&line[0], "%define ", 8)==0) {
    char var_name[80];
    int ii=0;
    char **ps;
    for(i=8; line[i]!='\n' && line[i]!=' '; i++, ii++) {
      var_name[ii] = line[i];
    }
    var_name[ii] = 0;
    /* Find the preprocessor variable */
    for(ps=&defd_vars[0]; *ps; ps++) {
      if(strcmp(*ps,var_name)==0) {
	error(input_file->lineno, 0, 0, "Preprocessor variable %s already defined", var_name);
      }
    }
    *ps = MALLOC(strlen(var_name)+1);
    strcpy(*ps, var_name);
    *++ps = NULL;
    goto NextLine;
  }

  if(Eflag) {
    printf("YPP: %s", line);
  }

  return cptr = line;
}